

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Interpolater.cpp
# Opt level: O1

void __thiscall
amrex::FaceLinear::interp_face
          (FaceLinear *this,FArrayBox *crse,int crse_comp,FArrayBox *fine,int fine_comp,int ncomp,
          Box *fine_region,IntVect *ratio,IArrayBox *solve_mask,Geometry *param_9,Geometry *param_10
          ,Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *param_11,int param_12,RunOn runon)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  int iVar23;
  uint uVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  uint uVar37;
  long lVar38;
  double *pdVar39;
  uint uVar40;
  uint uVar41;
  int iVar42;
  long lVar43;
  long lVar44;
  ulong uVar45;
  int iVar46;
  long lVar47;
  int iVar48;
  long lVar49;
  double *pdVar50;
  bool bVar51;
  double dVar52;
  double *local_190;
  double *local_178;
  ulong local_160;
  ulong local_138;
  ulong local_128;
  double *local_118;
  long local_d8;
  long local_60;
  long local_58;
  
  iVar1 = (fine->super_BaseFab<double>).domain.smallend.vect[0];
  lVar49 = (long)iVar1;
  iVar2 = (fine->super_BaseFab<double>).domain.smallend.vect[1];
  lVar43 = (long)iVar2;
  iVar3 = (fine->super_BaseFab<double>).domain.smallend.vect[2];
  lVar27 = (long)iVar3;
  lVar47 = (long)(((fine->super_BaseFab<double>).domain.bigend.vect[0] - iVar1) + 1);
  lVar34 = (long)(((fine->super_BaseFab<double>).domain.bigend.vect[1] - iVar2) + 1);
  lVar35 = lVar34 * lVar47;
  lVar44 = (long)(((fine->super_BaseFab<double>).domain.bigend.vect[2] - iVar3) + 1);
  lVar31 = lVar35 * lVar44;
  lVar32 = (long)fine_comp;
  iVar16 = (crse->super_BaseFab<double>).domain.smallend.vect[0];
  lVar36 = (long)(((crse->super_BaseFab<double>).domain.bigend.vect[0] - iVar16) + 1);
  iVar46 = (crse->super_BaseFab<double>).domain.smallend.vect[1];
  lVar38 = (((crse->super_BaseFab<double>).domain.bigend.vect[1] - iVar46) + 1) * lVar36;
  iVar48 = (crse->super_BaseFab<double>).domain.smallend.vect[2];
  lVar33 = (((crse->super_BaseFab<double>).domain.bigend.vect[2] - iVar48) + 1) * lVar38;
  lVar26 = crse_comp * lVar33;
  local_190 = (double *)(solve_mask->super_BaseFab<int>).dptr;
  if (local_190 == (double *)0x0) {
    iVar4 = 1;
    local_60 = 0;
    iVar5 = 1;
    iVar6 = 1;
    local_58 = 0;
    local_d8 = 0;
    local_190 = (double *)0x0;
  }
  else {
    iVar4 = (solve_mask->super_BaseFab<int>).domain.smallend.vect[0];
    iVar5 = (solve_mask->super_BaseFab<int>).domain.smallend.vect[1];
    iVar6 = (solve_mask->super_BaseFab<int>).domain.smallend.vect[2];
    local_d8 = (long)(((solve_mask->super_BaseFab<int>).domain.bigend.vect[0] - iVar4) + 1);
    local_58 = (((solve_mask->super_BaseFab<int>).domain.bigend.vect[1] - iVar5) + 1) * local_d8;
    local_60 = (((solve_mask->super_BaseFab<int>).domain.bigend.vect[2] - iVar6) + 1) * local_58;
  }
  local_178 = (fine->super_BaseFab<double>).dptr;
  lVar22 = lVar31 * lVar32;
  pdVar39 = (crse->super_BaseFab<double>).dptr;
  uVar21 = (fine_region->btype).itype;
  if ((uVar21 & 1) == 0) {
    iVar7 = ratio->vect[0];
    iVar8 = ratio->vect[1];
    iVar42 = ratio->vect[2];
    uVar15 = (fine_region->smallend).vect[1];
    uVar24 = (fine_region->smallend).vect[2];
    if ((uVar21 & 2) == 0) {
      if (0 < ncomp) {
        uVar9 = (fine_region->bigend).vect[2];
        iVar14 = (fine_region->bigend).vect[0];
        uVar20 = (fine_region->bigend).vect[1];
        iVar25 = (fine_region->smallend).vect[0];
        uVar17 = (ulong)iVar25;
        local_118 = local_178 + ((lVar22 + uVar17) - lVar49);
        local_160 = 0;
        do {
          if ((int)uVar24 <= (int)uVar9) {
            uVar18 = uVar24;
            do {
              if ((int)uVar15 <= (int)uVar20) {
                uVar28 = uVar18 + 1;
                uVar30 = -uVar28;
                if (0 < (int)uVar28) {
                  uVar30 = uVar28;
                }
                uVar40 = ~(uVar30 >> 1);
                uVar28 = ~(uVar30 >> 2);
                if (-1 < (int)uVar18) {
                  uVar40 = uVar18 >> 1;
                  uVar28 = uVar18 >> 2;
                }
                uVar13 = uVar15;
                do {
                  if (iVar25 <= iVar14) {
                    pdVar50 = (double *)
                              ((((int)uVar18 - lVar27) * lVar34 * 8 + lVar43 * -8 +
                               (long)(int)uVar13 * 8) * lVar47 + (long)local_118);
                    uVar29 = uVar13 + 1;
                    uVar37 = -uVar29;
                    if (0 < (int)uVar29) {
                      uVar37 = uVar29;
                    }
                    uVar29 = ~(uVar37 >> 2);
                    if (-1 < (int)uVar13) {
                      uVar29 = uVar13 >> 2;
                    }
                    uVar45 = uVar17;
                    uVar19 = ~(uVar37 >> 1);
                    if (-1 < (int)uVar13) {
                      uVar19 = uVar13 >> 1;
                    }
                    do {
                      uVar41 = uVar18;
                      if (((iVar42 != 1) && (uVar41 = uVar28, iVar42 != 4)) &&
                         (uVar41 = uVar40, iVar42 != 2)) {
                        if ((int)uVar18 < 0) {
                          uVar41 = ~((int)uVar30 / iVar42);
                        }
                        else {
                          uVar41 = (int)uVar18 / iVar42;
                        }
                      }
                      if (uVar41 * iVar42 == uVar18) {
                        uVar11 = (uint)uVar45;
                        if (iVar7 == 4) {
                          if ((long)uVar45 < 0) {
                            uVar11 = uVar11 + 1;
                            uVar12 = -uVar11;
                            if (0 < (int)uVar11) {
                              uVar12 = uVar11;
                            }
                            uVar11 = uVar12 >> 2;
LAB_005aeaed:
                            uVar11 = ~uVar11;
                          }
                          else {
                            uVar11 = (uint)(uVar45 >> 2) & 0x3fffffff;
                          }
                        }
                        else if (iVar7 == 2) {
                          if ((long)uVar45 < 0) {
                            uVar11 = uVar11 + 1;
                            uVar12 = -uVar11;
                            if (0 < (int)uVar11) {
                              uVar12 = uVar11;
                            }
                            uVar11 = uVar12 >> 1;
                            goto LAB_005aeaed;
                          }
                          uVar11 = (uint)(uVar45 >> 1) & 0x7fffffff;
                        }
                        else if (iVar7 != 1) {
                          if ((long)uVar45 < 0) {
                            iVar23 = uVar11 + 1;
                            iVar10 = -iVar23;
                            if (0 < iVar23) {
                              iVar10 = iVar23;
                            }
                            uVar11 = iVar10 / iVar7;
                            goto LAB_005aeaed;
                          }
                          uVar11 = (uint)((long)((ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 |
                                                uVar45 & 0xffffffff) / (long)iVar7);
                        }
                        uVar12 = uVar13;
                        if (((iVar8 != 1) && (uVar12 = uVar29, iVar8 != 4)) &&
                           (uVar12 = uVar19, iVar8 != 2)) {
                          if ((int)uVar13 < 0) {
                            uVar12 = ~((int)uVar37 / iVar8);
                          }
                          else {
                            uVar12 = (int)uVar13 / iVar8;
                          }
                        }
                        if ((local_190 == (double *)0x0) ||
                           (*(int *)((long)local_190 +
                                    ((int)(uVar12 - iVar5) * local_d8 +
                                    (long)(int)(uVar11 - iVar4) +
                                    (int)(uVar41 - iVar6) * local_58 + local_160 * local_60) * 4) !=
                            0)) {
                          *pdVar50 = pdVar39[lVar26 + (int)(uVar12 - iVar46) * lVar36 +
                                                      (long)(int)(uVar11 - iVar16) +
                                                      (int)(uVar41 - iVar48) * lVar38 +
                                                      local_160 * lVar33];
                        }
                      }
                      uVar45 = uVar45 + 1;
                      pdVar50 = pdVar50 + 1;
                    } while (iVar14 + 1 != (int)uVar45);
                  }
                  bVar51 = uVar13 != uVar20;
                  uVar13 = uVar13 + 1;
                } while (bVar51);
              }
              bVar51 = uVar18 != uVar9;
              uVar18 = uVar18 + 1;
            } while (bVar51);
          }
          local_160 = local_160 + 1;
          local_118 = local_118 + lVar31;
        } while (local_160 != (uint)ncomp);
      }
    }
    else if (0 < ncomp) {
      uVar9 = (fine_region->bigend).vect[2];
      iVar14 = (fine_region->bigend).vect[0];
      uVar20 = (fine_region->bigend).vect[1];
      iVar25 = (fine_region->smallend).vect[0];
      uVar17 = (ulong)iVar25;
      local_118 = local_178 + ((lVar22 + uVar17) - lVar49);
      local_160 = 0;
      do {
        if ((int)uVar24 <= (int)uVar9) {
          uVar18 = uVar24;
          do {
            if ((int)uVar15 <= (int)uVar20) {
              uVar28 = uVar18 + 1;
              uVar30 = -uVar28;
              if (0 < (int)uVar28) {
                uVar30 = uVar28;
              }
              uVar40 = ~(uVar30 >> 1);
              uVar28 = ~(uVar30 >> 2);
              if (-1 < (int)uVar18) {
                uVar40 = uVar18 >> 1;
                uVar28 = uVar18 >> 2;
              }
              uVar13 = uVar15;
              do {
                if (iVar25 <= iVar14) {
                  pdVar50 = (double *)
                            ((((int)uVar18 - lVar27) * lVar34 * 8 + lVar43 * -8 +
                             (long)(int)uVar13 * 8) * lVar47 + (long)local_118);
                  uVar29 = uVar13 + 1;
                  uVar37 = -uVar29;
                  if (0 < (int)uVar29) {
                    uVar37 = uVar29;
                  }
                  uVar29 = ~(uVar37 >> 2);
                  if (-1 < (int)uVar13) {
                    uVar29 = uVar13 >> 2;
                  }
                  uVar45 = uVar17;
                  uVar19 = ~(uVar37 >> 1);
                  if (-1 < (int)uVar13) {
                    uVar19 = uVar13 >> 1;
                  }
                  do {
                    uVar41 = uVar13;
                    if (((iVar8 != 1) && (uVar41 = uVar29, iVar8 != 4)) &&
                       (uVar41 = uVar19, iVar8 != 2)) {
                      if ((int)uVar13 < 0) {
                        uVar41 = ~((int)uVar37 / iVar8);
                      }
                      else {
                        uVar41 = (int)uVar13 / iVar8;
                      }
                    }
                    if (uVar41 * iVar8 == uVar13) {
                      uVar11 = (uint)uVar45;
                      if (iVar7 == 4) {
                        if ((long)uVar45 < 0) {
                          uVar11 = uVar11 + 1;
                          uVar12 = -uVar11;
                          if (0 < (int)uVar11) {
                            uVar12 = uVar11;
                          }
                          uVar11 = uVar12 >> 2;
LAB_005af2a1:
                          uVar11 = ~uVar11;
                        }
                        else {
                          uVar11 = (uint)(uVar45 >> 2) & 0x3fffffff;
                        }
                      }
                      else if (iVar7 == 2) {
                        if ((long)uVar45 < 0) {
                          uVar11 = uVar11 + 1;
                          uVar12 = -uVar11;
                          if (0 < (int)uVar11) {
                            uVar12 = uVar11;
                          }
                          uVar11 = uVar12 >> 1;
                          goto LAB_005af2a1;
                        }
                        uVar11 = (uint)(uVar45 >> 1) & 0x7fffffff;
                      }
                      else if (iVar7 != 1) {
                        if ((long)uVar45 < 0) {
                          iVar23 = uVar11 + 1;
                          iVar10 = -iVar23;
                          if (0 < iVar23) {
                            iVar10 = iVar23;
                          }
                          uVar11 = iVar10 / iVar7;
                          goto LAB_005af2a1;
                        }
                        uVar11 = (uint)((long)((ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 |
                                              uVar45 & 0xffffffff) / (long)iVar7);
                      }
                      uVar12 = uVar18;
                      if (((iVar42 != 1) && (uVar12 = uVar28, iVar42 != 4)) &&
                         (uVar12 = uVar40, iVar42 != 2)) {
                        if ((int)uVar18 < 0) {
                          uVar12 = ~((int)uVar30 / iVar42);
                        }
                        else {
                          uVar12 = (int)uVar18 / iVar42;
                        }
                      }
                      if ((local_190 == (double *)0x0) ||
                         (*(int *)((long)local_190 +
                                  ((int)(uVar41 - iVar5) * local_d8 +
                                  (long)(int)(uVar11 - iVar4) +
                                  (int)(uVar12 - iVar6) * local_58 + local_160 * local_60) * 4) != 0
                         )) {
                        *pdVar50 = pdVar39[lVar26 + (int)(uVar41 - iVar46) * lVar36 +
                                                    (long)(int)(uVar11 - iVar16) +
                                                    (int)(uVar12 - iVar48) * lVar38 +
                                                    local_160 * lVar33];
                      }
                    }
                    uVar45 = uVar45 + 1;
                    pdVar50 = pdVar50 + 1;
                  } while (iVar14 + 1 != (int)uVar45);
                }
                bVar51 = uVar13 != uVar20;
                uVar13 = uVar13 + 1;
              } while (bVar51);
            }
            bVar51 = uVar18 != uVar9;
            uVar18 = uVar18 + 1;
          } while (bVar51);
        }
        local_160 = local_160 + 1;
        local_118 = local_118 + lVar31;
      } while (local_160 != (uint)ncomp);
    }
  }
  else if (0 < ncomp) {
    iVar7 = ratio->vect[0];
    iVar8 = ratio->vect[1];
    iVar42 = ratio->vect[2];
    uVar15 = (fine_region->smallend).vect[1];
    uVar24 = (fine_region->smallend).vect[2];
    uVar9 = (fine_region->bigend).vect[2];
    iVar14 = (fine_region->bigend).vect[0];
    uVar20 = (fine_region->bigend).vect[1];
    iVar25 = (fine_region->smallend).vect[0];
    uVar17 = (ulong)iVar25;
    local_118 = local_178 + ((lVar22 + uVar17) - lVar49);
    local_128 = 0;
    do {
      if ((int)uVar24 <= (int)uVar9) {
        uVar18 = uVar24;
        do {
          if ((int)uVar15 <= (int)uVar20) {
            uVar28 = uVar18 + 1;
            uVar30 = -uVar28;
            if (0 < (int)uVar28) {
              uVar30 = uVar28;
            }
            uVar40 = ~(uVar30 >> 1);
            uVar28 = ~(uVar30 >> 2);
            if (-1 < (int)uVar18) {
              uVar40 = uVar18 >> 1;
              uVar28 = uVar18 >> 2;
            }
            uVar13 = uVar15;
            do {
              if (iVar25 <= iVar14) {
                pdVar50 = (double *)
                          ((((int)uVar18 - lVar27) * lVar34 * 8 + lVar43 * -8 +
                           (long)(int)uVar13 * 8) * lVar47 + (long)local_118);
                uVar29 = uVar13 + 1;
                uVar37 = -uVar29;
                if (0 < (int)uVar29) {
                  uVar37 = uVar29;
                }
                uVar29 = ~(uVar37 >> 2);
                if (-1 < (int)uVar13) {
                  uVar29 = uVar13 >> 2;
                }
                uVar45 = uVar17;
                uVar19 = ~(uVar37 >> 1);
                if (-1 < (int)uVar13) {
                  uVar19 = uVar13 >> 1;
                }
                do {
                  uVar41 = (uint)uVar45;
                  if (iVar7 == 4) {
                    if ((long)uVar45 < 0) {
                      uVar12 = uVar41 + 1;
                      uVar11 = -uVar12;
                      if (0 < (int)uVar12) {
                        uVar11 = uVar12;
                      }
                      uVar11 = uVar11 >> 2;
LAB_005aee86:
                      uVar11 = ~uVar11;
                    }
                    else {
                      uVar11 = (uint)(uVar45 >> 2) & 0x3fffffff;
                    }
                  }
                  else if (iVar7 == 2) {
                    if ((long)uVar45 < 0) {
                      uVar12 = uVar41 + 1;
                      uVar11 = -uVar12;
                      if (0 < (int)uVar12) {
                        uVar11 = uVar12;
                      }
                      uVar11 = uVar11 >> 1;
                      goto LAB_005aee86;
                    }
                    uVar11 = (uint)(uVar45 >> 1) & 0x7fffffff;
                  }
                  else {
                    uVar11 = uVar41;
                    if (iVar7 != 1) {
                      if ((long)uVar45 < 0) {
                        iVar23 = uVar41 + 1;
                        iVar10 = -iVar23;
                        if (0 < iVar23) {
                          iVar10 = iVar23;
                        }
                        uVar11 = iVar10 / iVar7;
                        goto LAB_005aee86;
                      }
                      uVar11 = (uint)((long)((ulong)(uint)((int)uVar41 >> 0x1f) << 0x20 |
                                            uVar45 & 0xffffffff) / (long)iVar7);
                    }
                  }
                  if (uVar41 == uVar11 * iVar7) {
                    uVar41 = uVar13;
                    if (((iVar8 != 1) && (uVar41 = uVar29, iVar8 != 4)) &&
                       (uVar41 = uVar19, iVar8 != 2)) {
                      if ((int)uVar13 < 0) {
                        uVar41 = ~((int)uVar37 / iVar8);
                      }
                      else {
                        uVar41 = (int)uVar13 / iVar8;
                      }
                    }
                    uVar12 = uVar18;
                    if (((iVar42 != 1) && (uVar12 = uVar28, iVar42 != 4)) &&
                       (uVar12 = uVar40, iVar42 != 2)) {
                      if ((int)uVar18 < 0) {
                        uVar12 = ~((int)uVar30 / iVar42);
                      }
                      else {
                        uVar12 = (int)uVar18 / iVar42;
                      }
                    }
                    if ((local_190 == (double *)0x0) ||
                       (*(int *)((long)local_190 +
                                ((int)(uVar41 - iVar5) * local_d8 +
                                (long)(int)(uVar11 - iVar4) +
                                (int)(uVar12 - iVar6) * local_58 + local_128 * local_60) * 4) != 0))
                    {
                      *pdVar50 = pdVar39[lVar26 + (int)(uVar41 - iVar46) * lVar36 +
                                                  (long)(int)(uVar11 - iVar16) +
                                                  (int)(uVar12 - iVar48) * lVar38 +
                                                  local_128 * lVar33];
                    }
                  }
                  uVar45 = uVar45 + 1;
                  pdVar50 = pdVar50 + 1;
                } while (iVar14 + 1 != (int)uVar45);
              }
              bVar51 = uVar13 != uVar20;
              uVar13 = uVar13 + 1;
            } while (bVar51);
          }
          bVar51 = uVar18 != uVar9;
          uVar18 = uVar18 + 1;
        } while (bVar51);
      }
      local_128 = local_128 + 1;
      local_118 = local_118 + lVar31;
    } while (local_128 != (uint)ncomp);
  }
  if ((uVar21 & 1) == 0) {
    uVar15 = (fine_region->smallend).vect[1];
    uVar24 = (fine_region->smallend).vect[2];
    if ((uVar21 & 2) == 0) {
      if (0 < ncomp) {
        iVar1 = ratio->vect[2];
        uVar21 = (fine_region->bigend).vect[2];
        iVar2 = (fine_region->bigend).vect[0];
        uVar9 = (fine_region->bigend).vect[1];
        iVar16 = (fine_region->smallend).vect[0];
        local_178 = local_178 + (iVar16 - lVar49);
        uVar17 = 0;
        do {
          uVar20 = uVar24;
          if ((int)uVar24 <= (int)uVar21) {
            do {
              if ((int)uVar15 <= (int)uVar9) {
                uVar30 = uVar20 + 1;
                uVar18 = -uVar30;
                if (0 < (int)uVar30) {
                  uVar18 = uVar30;
                }
                uVar30 = ~(uVar18 >> 1);
                uVar28 = ~(uVar18 >> 2);
                if (-1 < (int)uVar20) {
                  uVar30 = uVar20 >> 1;
                  uVar28 = uVar20 >> 2;
                }
                uVar40 = uVar15;
                do {
                  if (iVar16 <= iVar2) {
                    lVar26 = (lVar32 * lVar44 * lVar34 * 8 + lVar43 * -8 + (long)(int)uVar40 * 8) *
                             lVar47;
                    lVar33 = 0;
                    do {
                      uVar13 = uVar20;
                      if (((iVar1 != 1) && (uVar13 = uVar28, iVar1 != 4)) &&
                         (uVar13 = uVar30, iVar1 != 2)) {
                        if ((int)uVar20 < 0) {
                          uVar13 = ~((int)uVar18 / iVar1);
                        }
                        else {
                          uVar13 = (int)uVar20 / iVar1;
                        }
                      }
                      iVar46 = uVar20 - uVar13 * iVar1;
                      if (iVar46 != 0) {
                        dVar52 = (double)iVar46 * (1.0 / (double)iVar1);
                        *(double *)
                         ((long)local_178 +
                         lVar33 * 8 +
                         ((lVar32 * lVar44 * 8 + lVar27 * -8 + (long)(int)uVar20 * 8) * lVar34 +
                          lVar43 * -8 + (long)(int)uVar40 * 8) * lVar47) =
                             (1.0 - dVar52) *
                             *(double *)
                              ((long)local_178 +
                              lVar33 * 8 + (long)(int)(uVar13 * iVar1 - iVar3) * lVar35 * 8 + lVar26
                              ) + dVar52 * *(double *)
                                            ((long)local_178 +
                                            lVar33 * 8 +
                                            (long)(int)((uVar13 + 1) * iVar1 - iVar3) * lVar35 * 8 +
                                            lVar26);
                      }
                      lVar33 = lVar33 + 1;
                    } while ((iVar2 - iVar16) + 1 != (int)lVar33);
                  }
                  bVar51 = uVar40 != uVar9;
                  uVar40 = uVar40 + 1;
                } while (bVar51);
              }
              bVar51 = uVar20 != uVar21;
              uVar20 = uVar20 + 1;
            } while (bVar51);
          }
          uVar17 = uVar17 + 1;
          local_178 = local_178 + lVar31;
        } while (uVar17 != (uint)ncomp);
      }
    }
    else if (0 < ncomp) {
      iVar1 = ratio->vect[1];
      uVar21 = (fine_region->bigend).vect[2];
      iVar2 = (fine_region->bigend).vect[0];
      uVar9 = (fine_region->bigend).vect[1];
      iVar3 = (fine_region->smallend).vect[0];
      iVar16 = (iVar2 - iVar3) + 1;
      local_178 = local_178 + (iVar3 - lVar49);
      uVar17 = 0;
      do {
        uVar20 = uVar24;
        if ((int)uVar24 <= (int)uVar21) {
          do {
            if ((int)uVar15 <= (int)uVar9) {
              lVar26 = (lVar32 * lVar44 * 8 + lVar27 * -8 + (long)(int)uVar20 * 8) * lVar34 +
                       lVar43 * -8;
              uVar18 = uVar15;
              do {
                if (iVar3 <= iVar2) {
                  uVar28 = uVar18 + 1;
                  uVar30 = -uVar28;
                  if (0 < (int)uVar28) {
                    uVar30 = uVar28;
                  }
                  pdVar39 = local_178;
                  iVar46 = iVar16;
                  uVar40 = ~(uVar30 >> 2);
                  uVar28 = ~(uVar30 >> 1);
                  if (-1 < (int)uVar18) {
                    uVar40 = uVar18 >> 2;
                    uVar28 = uVar18 >> 1;
                  }
                  do {
                    uVar13 = uVar18;
                    if (((iVar1 != 1) && (uVar13 = uVar40, iVar1 != 4)) &&
                       (uVar13 = uVar28, iVar1 != 2)) {
                      if ((int)uVar18 < 0) {
                        uVar13 = ~((int)uVar30 / iVar1);
                      }
                      else {
                        uVar13 = (int)uVar18 / iVar1;
                      }
                    }
                    iVar48 = uVar18 - uVar13 * iVar1;
                    if (iVar48 != 0) {
                      dVar52 = (double)iVar48 * (1.0 / (double)iVar1);
                      *(double *)((long)pdVar39 + (lVar26 + (long)(int)uVar18 * 8) * lVar47) =
                           (1.0 - dVar52) *
                           *(double *)
                            ((long)pdVar39 + (lVar26 + (long)(int)(uVar13 * iVar1) * 8) * lVar47) +
                           dVar52 * *(double *)
                                     ((long)pdVar39 +
                                     (lVar26 + (long)(int)((uVar13 + 1) * iVar1) * 8) * lVar47);
                    }
                    iVar46 = iVar46 + -1;
                    pdVar39 = pdVar39 + 1;
                  } while (iVar46 != 0);
                }
                bVar51 = uVar18 != uVar9;
                uVar18 = uVar18 + 1;
              } while (bVar51);
            }
            bVar51 = uVar20 != uVar21;
            uVar20 = uVar20 + 1;
          } while (bVar51);
        }
        uVar17 = uVar17 + 1;
        local_178 = local_178 + lVar31;
      } while (uVar17 != (uint)ncomp);
    }
  }
  else if (0 < ncomp) {
    iVar16 = ratio->vect[0];
    iVar46 = (fine_region->smallend).vect[1];
    iVar48 = (fine_region->smallend).vect[2];
    iVar4 = (fine_region->bigend).vect[2];
    iVar5 = (fine_region->bigend).vect[0];
    iVar6 = (fine_region->bigend).vect[1];
    iVar7 = (fine_region->smallend).vect[0];
    local_190 = local_178 + ((lVar22 + iVar7) - lVar49);
    local_138 = 0;
    do {
      if (iVar48 <= iVar4) {
        iVar8 = iVar48;
        do {
          if (iVar46 <= iVar6) {
            lVar26 = (iVar8 - iVar3) * lVar35;
            iVar42 = iVar46;
            do {
              if (iVar7 <= iVar5) {
                pdVar39 = (double *)
                          (((iVar8 - lVar27) * lVar34 * 8 + lVar43 * -8 + (long)iVar42 * 8) * lVar47
                          + (long)local_190);
                lVar32 = (iVar42 - iVar2) * lVar47;
                uVar17 = (long)iVar7;
                do {
                  uVar21 = (uint)uVar17;
                  if (iVar16 == 4) {
                    if ((long)uVar17 < 0) {
                      uVar24 = uVar21 + 1;
                      uVar15 = -uVar24;
                      if (0 < (int)uVar24) {
                        uVar15 = uVar24;
                      }
                      uVar15 = uVar15 >> 2;
LAB_005af840:
                      uVar15 = ~uVar15;
                    }
                    else {
                      uVar15 = (uint)(uVar17 >> 2) & 0x3fffffff;
                    }
                  }
                  else if (iVar16 == 2) {
                    if ((long)uVar17 < 0) {
                      uVar24 = uVar21 + 1;
                      uVar15 = -uVar24;
                      if (0 < (int)uVar24) {
                        uVar15 = uVar24;
                      }
                      uVar15 = uVar15 >> 1;
                      goto LAB_005af840;
                    }
                    uVar15 = (uint)(uVar17 >> 1) & 0x7fffffff;
                  }
                  else {
                    uVar15 = uVar21;
                    if (iVar16 != 1) {
                      if ((long)uVar17 < 0) {
                        iVar25 = uVar21 + 1;
                        iVar14 = -iVar25;
                        if (0 < iVar25) {
                          iVar14 = iVar25;
                        }
                        uVar15 = iVar14 / iVar16;
                        goto LAB_005af840;
                      }
                      uVar15 = (uint)((long)((ulong)(uint)((int)uVar21 >> 0x1f) << 0x20 |
                                            uVar17 & 0xffffffff) / (long)iVar16);
                    }
                  }
                  if (uVar21 != uVar15 * iVar16) {
                    dVar52 = (double)(int)(-iVar16 * uVar15 + uVar21) * (1.0 / (double)iVar16);
                    *pdVar39 = (1.0 - dVar52) *
                               local_178[lVar22 + local_138 * lVar31 +
                                                  lVar26 + lVar32 + (int)(uVar15 * iVar16 - iVar1)]
                               + dVar52 * local_178[lVar22 + local_138 * lVar31 +
                                                             lVar26 + lVar32 + (int)((uVar15 + 1) *
                                                                                     iVar16 - iVar1)
                                                   ];
                  }
                  uVar17 = uVar17 + 1;
                  pdVar39 = pdVar39 + 1;
                } while (iVar5 + 1 != (int)uVar17);
              }
              bVar51 = iVar42 != iVar6;
              iVar42 = iVar42 + 1;
            } while (bVar51);
          }
          bVar51 = iVar8 != iVar4;
          iVar8 = iVar8 + 1;
        } while (bVar51);
      }
      local_138 = local_138 + 1;
      local_190 = local_190 + lVar31;
    } while (local_138 != (uint)ncomp);
  }
  return;
}

Assistant:

void
FaceLinear::interp_face (const FArrayBox&  crse,
                         const int         crse_comp,
                         FArrayBox&        fine,
                         const int         fine_comp,
                         const int         ncomp,
                         const Box&        fine_region,
                         const IntVect&    ratio,
                         const IArrayBox&  solve_mask,
                         const Geometry& /*crse_geom */,
                         const Geometry& /*fine_geom */,
                         Vector<BCRec> const& /*bcr*/,
                         const int         /*bccomp*/,
                         RunOn             runon)
{
    BL_PROFILE("FaceLinear::interp_face()");

    AMREX_ASSERT(AMREX_D_TERM(fine_region.type(0),+fine_region.type(1),+fine_region.type(2)) == 1);

    Array4<Real> const& fine_arr = fine.array(fine_comp);
    Array4<Real const> const& crse_arr = crse.const_array(crse_comp);
    Array4<const int> mask_arr;
    if (solve_mask.isAllocated()) {
        mask_arr = solve_mask.const_array();
    }

    //
    // Fill fine ghost faces with piecewise-constant interpolation of coarse data.
    // Operate only on faces that overlap--ie, only fill the fine faces that make up each
    // coarse face, leave the in-between faces alone.
    // The mask ensures we do not overwrite valid fine cells.
    //
    if (fine_region.type(0) == IndexType::NODE)
    {
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon,fine_region,ncomp,i,j,k,n,
        {
            face_linear_face_interp_x(i,j,k,n,fine_arr,crse_arr,mask_arr,ratio);
        });
    }
#if (AMREX_SPACEDIM >= 2)
    else if (fine_region.type(1) == IndexType::NODE)
    {
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon,fine_region,ncomp,i,j,k,n,
        {
            face_linear_face_interp_y(i,j,k,n,fine_arr,crse_arr,mask_arr,ratio);
        });
    }
#if (AMREX_SPACEDIM == 3)
    else
    {
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon,fine_region,ncomp,i,j,k,n,
        {
            face_linear_face_interp_z(i,j,k,n,fine_arr,crse_arr,mask_arr,ratio);
        });
    }
#endif
#endif

    //
    // Interpolate unfilled grow cells using best data from
    // surrounding faces of valid region, and pc-interpd data
    // on fine faces overlaying coarse edges.
    //
    if (fine_region.type(0) == IndexType::NODE)
    {
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon,fine_region,ncomp,i,j,k,n,
        {
            face_linear_interp_x(i,j,k,n,fine_arr,ratio);
        });
    }
#if (AMREX_SPACEDIM >= 2)
    else if (fine_region.type(1) == IndexType::NODE)
    {
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon,fine_region,ncomp,i,j,k,n,
        {
            face_linear_interp_y(i,j,k,n,fine_arr,ratio);
        });
    }
#if (AMREX_SPACEDIM == 3)
    else
    {
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon,fine_region,ncomp,i,j,k,n,
        {
            face_linear_interp_z(i,j,k,n,fine_arr,ratio);
        });
    }
#endif
#endif
}